

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O1

int __thiscall LPCMStreamReader::readPacket(LPCMStreamReader *this,AVPacket *avPacket)

{
  uint8_t **ppuVar1;
  int64_t *piVar2;
  uint64_t *puVar3;
  uint8_t *puVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  longlong lVar9;
  size_t __n;
  int64_t iVar10;
  ostream *poVar11;
  undefined4 *puVar12;
  uint uVar13;
  pointer __dest;
  ulong uVar14;
  uint8_t *puVar15;
  int skipBeforeBytes;
  int skipBytes;
  ostringstream ss;
  int local_1d0;
  int local_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  string local_1a8 [11];
  
  avPacket->flags = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_flags;
  avPacket->stream_index =
       (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_streamIndex;
  avPacket->codecID = ::lpcmCodecInfo.codecID;
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->duration = 0;
  lVar8 = (long)((this->super_SimplePacketizerReader).m_curPts *
                (this->super_SimplePacketizerReader).m_stretch) +
          (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_timeOffset;
  avPacket->pts = lVar8;
  avPacket->dts = lVar8;
  puVar15 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
  puVar4 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
  if (puVar4 < puVar15) {
    __assert_fail("m_curPos <= m_bufEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/lpcmStreamReader.cpp"
                  ,0x304,"virtual int LPCMStreamReader::readPacket(AVPacket &)");
  }
  if (puVar15 == puVar4) {
    return 1;
  }
  local_1cc = 0;
  local_1d0 = 0;
  if ((this->super_SimplePacketizerReader).m_needSync != true) goto LAB_00195280;
  if ((this->m_headerType == htNone) &&
     (bVar5 = detectLPCMType(this,puVar15,(long)puVar4 - (long)puVar15), !bVar5)) {
    puVar15 = (uint8_t *)0x0;
  }
  puVar4 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
  if (puVar15 == (uint8_t *)0x0) {
    piVar2 = &(this->super_SimplePacketizerReader).m_processedBytes;
    *piVar2 = (int64_t)(puVar4 + (*piVar2 -
                                 (long)(this->super_SimplePacketizerReader).
                                       super_AbstractStreamReader.m_curPos));
LAB_00195151:
    puVar15 = (uint8_t *)0x1;
    bVar5 = false;
  }
  else {
    iVar6 = decodeFrame(this,puVar15,puVar4,&local_1cc,&local_1d0);
    if (iVar6 == -10) {
      puVar15 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
      memcpy((this->super_SimplePacketizerReader).m_tmpBuffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,puVar15,
             (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
             (long)puVar15);
      puVar15 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_tmpBufferLen =
           (long)puVar15 -
           (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos = puVar15;
      goto LAB_00195151;
    }
    puVar4 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
    iVar7 = iVar6 + local_1cc + local_1d0;
    if (iVar7 == 0 || SCARRY4(iVar6 + local_1cc,local_1d0) != iVar7 < 0) {
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos = puVar4 + 1;
      piVar2 = &(this->super_SimplePacketizerReader).m_processedBytes;
      *piVar2 = *piVar2 + 1;
      bVar5 = false;
      puVar15 = (uint8_t *)0x0;
    }
    else {
      piVar2 = &(this->super_SimplePacketizerReader).m_processedBytes;
      *piVar2 = (int64_t)(puVar15 + (*piVar2 - (long)puVar4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Decoding ",9);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,::lpcmCodecInfo.displayName._M_dataplus._M_p,
                           ::lpcmCodecInfo.displayName._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," stream (track ",0xf);
      poVar11 = (ostream *)
                std::ostream::operator<<
                          (poVar11,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                   m_streamIndex);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"): ",3);
      getStreamInfo_abi_cxx11_(local_1a8,this);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      sLastMsg = true;
      (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos = puVar15;
      (this->super_SimplePacketizerReader).m_needSync = false;
      bVar5 = true;
    }
  }
  if (!bVar5) {
    return (int)puVar15;
  }
LAB_00195280:
  lVar9 = llround((this->super_SimplePacketizerReader).m_curPts *
                  (this->super_SimplePacketizerReader).m_stretch);
  lVar8 = lVar9 + (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_timeOffset;
  avPacket->pts = lVar8;
  avPacket->dts = lVar8;
  puVar15 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
  puVar4 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
  __n = (long)puVar4 - (long)puVar15;
  if ((long)__n < 4) {
    __dest = (this->super_SimplePacketizerReader).m_tmpBuffer.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    local_1cc = 0;
    local_1d0 = 0;
    iVar6 = decodeFrame(this,puVar15,puVar4,&local_1cc,&local_1d0);
    if (iVar6 == -10) {
      __dest = (this->super_SimplePacketizerReader).m_tmpBuffer.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar15 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
      __n = (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
            (long)puVar15;
    }
    else {
      uVar13 = local_1d0 + local_1cc + iVar6;
      if (uVar13 == 0 || SCARRY4(local_1d0,local_1cc + iVar6) != (int)uVar13 < 0) {
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,::lpcmCodecInfo.displayName._M_dataplus._M_p,
                             ::lpcmCodecInfo.displayName._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11," bad frame detected. Resync stream.",0x23);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        sLastMsg = true;
        (this->super_SimplePacketizerReader).m_needSync = true;
        return 0;
      }
      puVar15 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
      __n = (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd -
            (long)puVar15;
      uVar14 = (ulong)uVar13;
      if ((long)uVar14 <= (long)__n) {
        avPacket->data = puVar15 + local_1d0;
        if (this->m_curChunkLen != 0) {
          this->m_curChunkLen = this->m_curChunkLen - (long)iVar6;
        }
        if (0x8000 < iVar6) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"AV frame too large (",0x14);
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11," bytes). Increase AV buffer.",0x1c);
          puVar12 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar12 = 800;
          *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
          if (local_1c8 == &local_1b8) {
            puVar12[6] = local_1b8;
            puVar12[7] = uStack_1b4;
            puVar12[8] = uStack_1b0;
            puVar12[9] = uStack_1ac;
          }
          else {
            *(uint **)(puVar12 + 2) = local_1c8;
            *(ulong *)(puVar12 + 6) = CONCAT44(uStack_1b4,local_1b8);
          }
          *(undefined8 *)(puVar12 + 4) = local_1c0;
          local_1c0 = 0;
          local_1b8 = local_1b8 & 0xffffff00;
          local_1c8 = &local_1b8;
          __cxa_throw(puVar12,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        avPacket->size = iVar6;
        iVar10 = 0x193bf60;
        if (this->m_frameRest != 0) {
          iVar10 = 0;
        }
        avPacket->duration = iVar10;
        (this->super_SimplePacketizerReader).m_curPts =
             (double)(int)iVar10 + (this->super_SimplePacketizerReader).m_curPts;
        SimplePacketizerReader::doMplsCorrection(&this->super_SimplePacketizerReader);
        if (((this->m_headerType & ~htM2TS) == htWAVE) &&
           ((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_demuxMode == false)) {
          iVar6 = convertWavToPCM(this,avPacket->data,avPacket->data + avPacket->size);
          avPacket->size = iVar6;
          avPacket->data = this->m_tmpFrameBuffer;
        }
        puVar3 = &(this->super_SimplePacketizerReader).m_frameNum;
        *puVar3 = *puVar3 + 1;
        ppuVar1 = &(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
        *ppuVar1 = *ppuVar1 + uVar14;
        piVar2 = &(this->super_SimplePacketizerReader).m_processedBytes;
        *piVar2 = *piVar2 + uVar14;
        if (this->m_frameRest == 0) {
          avPacket->flags =
               (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_flags + 6;
          return 0;
        }
        return 0;
      }
      __dest = (this->super_SimplePacketizerReader).m_tmpBuffer.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  memmove(__dest,puVar15,__n);
  puVar15 = (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd;
  (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_tmpBufferLen =
       (long)puVar15 -
       (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos;
  (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_curPos = puVar15;
  return 1;
}

Assistant:

int LPCMStreamReader::readPacket(AVPacket& avPacket)
{
    avPacket.flags = m_flags;  // + AVPacket::IS_COMPLETE_FRAME | AVPacket::FORCE_NEW_FRAME;
    avPacket.stream_index = m_streamIndex;
    avPacket.codecID = getCodecInfo().codecID;
    avPacket.codec = this;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.duration = 0;
    avPacket.dts = avPacket.pts = static_cast<int64_t>(m_curPts * m_stretch) + m_timeOffset;
    assert(m_curPos <= m_bufEnd);
    if (m_curPos == m_bufEnd)
        return NEED_MORE_DATA;
    int skipBytes = 0;
    int skipBeforeBytes = 0;
    if (m_needSync)
    {
        uint8_t* frame = findFrame(m_curPos, m_bufEnd);
        if (frame == nullptr)
        {
            m_processedBytes += m_bufEnd - m_curPos;
            return NEED_MORE_DATA;
        }
        const int decodeRez = decodeFrame(frame, m_bufEnd, skipBytes, skipBeforeBytes);
        if (decodeRez == NOT_ENOUGH_BUFFER)
        {
            memcpy(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
            m_tmpBufferLen = m_bufEnd - m_curPos;
            m_curPos = m_bufEnd;
            return NEED_MORE_DATA;
        }
        if (decodeRez + skipBytes + skipBeforeBytes <= 0)
        {
            m_curPos++;
            m_processedBytes++;
            return 0;
        }
        m_processedBytes += frame - m_curPos;
        LTRACE(LT_INFO, 2,
               "Decoding " << getCodecInfo().displayName << " stream (track " << m_streamIndex
                           << "): " << getStreamInfo());
        m_curPos = frame;
        m_needSync = false;
    }
    avPacket.dts = avPacket.pts = llround(m_curPts * m_stretch) + m_timeOffset;
    if (m_bufEnd - m_curPos < getHeaderLen())
    {
        memmove(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
        m_tmpBufferLen = m_bufEnd - m_curPos;
        m_curPos = m_bufEnd;
        return NEED_MORE_DATA;
    }
    skipBytes = 0;
    skipBeforeBytes = 0;
    const int frameLen = decodeFrame(m_curPos, m_bufEnd, skipBytes, skipBeforeBytes);
    if (frameLen == NOT_ENOUGH_BUFFER)
    {
        memmove(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
        m_tmpBufferLen = m_bufEnd - m_curPos;
        m_curPos = m_bufEnd;
        return NEED_MORE_DATA;
    }
    if (frameLen + skipBytes + skipBeforeBytes <= 0)
    {
        LTRACE(LT_INFO, 2, getCodecInfo().displayName << " bad frame detected. Resync stream.");
        m_needSync = true;
        return 0;
    }
    if (m_bufEnd - m_curPos < frameLen + skipBytes + skipBeforeBytes)
    {
        memmove(m_tmpBuffer.data(), m_curPos, m_bufEnd - m_curPos);
        m_tmpBufferLen = m_bufEnd - m_curPos;
        m_curPos = m_bufEnd;
        return NEED_MORE_DATA;
    }
    avPacket.data = m_curPos;
    avPacket.data += skipBeforeBytes;
    if (m_curChunkLen)
        m_curChunkLen -= frameLen;
    if (frameLen > MAX_AV_PACKET_SIZE)
        THROW(ERR_AV_FRAME_TOO_LARGE, "AV frame too large (" << frameLen << " bytes). Increase AV buffer.")
    avPacket.size = frameLen;
    avPacket.duration = static_cast<int64_t>(getFrameDuration());  // m_ptsIncPerFrame;
    m_curPts += static_cast<double>(avPacket.duration);
    doMplsCorrection();
    if ((m_headerType == LPCMHeaderType::htWAVE || m_headerType == LPCMHeaderType::htWAVE64) && !m_demuxMode)
    {
        avPacket.size = convertWavToPCM(avPacket.data, avPacket.data + avPacket.size);
        avPacket.data = m_tmpFrameBuffer;
    }

    m_frameNum++;
    if (m_frameNum % 1000 == 0)
        LTRACE(LT_DEBUG, 0, "Processed " << m_frameNum << " " << getCodecInfo().displayName << " frames");
    m_curPos += frameLen + skipBytes + skipBeforeBytes;
    m_processedBytes += frameLen + skipBytes + skipBeforeBytes;
    if (m_frameRest == 0)
        avPacket.flags = m_flags + (AVPacket::IS_COMPLETE_FRAME | AVPacket::FORCE_NEW_FRAME);
    return 0;
}